

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeBatchResult.cpp
# Opt level: O2

void __thiscall xe::TestCaseResultData::~TestCaseResultData(TestCaseResultData *this)

{
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__cxx11::string::~string((string *)&this->m_statusDetails);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

TestCaseResultData::~TestCaseResultData (void)
{
}